

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint64_t helper_unpack(target_ulong_conflict arg1)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined4 local_28;
  undefined4 local_24;
  int32_t int_mant;
  int32_t int_exp;
  uint64_t ret;
  int32_t fp_frac;
  int32_t fp_exp;
  target_ulong_conflict arg1_local;
  
  uVar1 = extract32(arg1,0x17,8);
  uVar2 = extract32(arg1,0,0x17);
  if (uVar1 == 0xff) {
    local_24 = 0xff;
    local_28 = uVar2 << 7;
  }
  else if ((uVar1 == 0) && (uVar2 == 0)) {
    local_24 = -0x7f;
    local_28 = 0;
  }
  else if ((uVar1 == 0) && (uVar2 != 0)) {
    local_24 = -0x7e;
    local_28 = uVar2 << 7;
  }
  else {
    local_24 = uVar1 - 0x7f;
    local_28 = uVar2 << 7 | 0x40000000;
  }
  return (long)(int)local_28 | (long)local_24 << 0x20;
}

Assistant:

uint64_t helper_unpack(target_ulong arg1)
{
    int32_t fp_exp  = extract32(arg1, 23, 8);
    int32_t fp_frac = extract32(arg1, 0, 23);
    uint64_t ret;
    int32_t int_exp, int_mant;

    if (fp_exp == 255) {
        int_exp = 255;
        int_mant = (fp_frac << 7);
    } else if ((fp_exp == 0) && (fp_frac == 0)) {
        int_exp  = -127;
        int_mant = 0;
    } else if ((fp_exp == 0) && (fp_frac != 0)) {
        int_exp  = -126;
        int_mant = (fp_frac << 7);
    } else {
        int_exp  = fp_exp - 127;
        int_mant = (fp_frac << 7);
        int_mant |= (1 << 30);
    }
    ret = int_exp;
    ret = ret << 32;
    ret |= int_mant;

    return ret;
}